

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  xml_attribute_struct *pxVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  
  uVar5 = pred.prefix_length;
  pcVar6 = pred.prefix;
  if (this->_root == (xml_node_struct *)0x0) {
    return (xml_attribute)(xml_attribute_struct *)0x0;
  }
  pxVar4 = this->_root->first_attribute;
  if (pxVar4 != (xml_attribute_struct *)0x0) {
    do {
      pcVar7 = pxVar4->name;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      if (*pcVar7 == 'x') {
        lVar8 = 0;
        do {
          lVar2 = lVar8 + 1;
          if (lVar8 == 4) break;
          lVar3 = lVar8 + 1;
          lVar8 = lVar8 + 1;
        } while (pcVar7[lVar3] == "xmlns"[lVar2]);
        if ("xmlns"[lVar2] == '\0') {
          pcVar9 = pcVar7 + 5;
          if (pcVar6 == (char *)0x0) {
LAB_0016665e:
            if (*pcVar9 == '\0') {
              return (xml_attribute)pxVar4;
            }
          }
          else if (*pcVar9 == ':') {
            if (uVar5 == 0) {
LAB_0016665b:
              pcVar9 = pcVar7 + 6 + uVar5;
              goto LAB_0016665e;
            }
            if (pcVar7[6] == *pcVar6) {
              uVar10 = 0;
              do {
                if (uVar5 - 1 == uVar10) goto LAB_0016665b;
                lVar8 = uVar10 + 7;
                uVar1 = uVar10 + 1;
                lVar2 = uVar10 + 1;
                uVar10 = uVar1;
              } while (pcVar7[lVar8] == pcVar6[lVar2]);
              if (uVar5 <= uVar1) goto LAB_0016665b;
            }
          }
        }
      }
      pxVar4 = pxVar4->next_attribute;
    } while (pxVar4 != (xml_attribute_struct *)0x0);
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}